

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_elements_transaction.cpp
# Opt level: O2

void __thiscall
cfdcapi_elements_transaction_CreateRawTransaction_Test::TestBody
          (cfdcapi_elements_transaction_CreateRawTransaction_Test *this)

{
  char *pcVar1;
  char *in_R9;
  AssertHelper local_78;
  AssertHelper local_70;
  int ret;
  AssertionResult gtest_ar;
  uint32_t index;
  char *tx_string2;
  void *handle;
  char *tx_string;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  AssertHelper local_18;
  
  handle = (void *)0x0;
  ret = CfdCreateHandle(&handle);
  tx_string = (char *)((ulong)tx_string._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&tx_string,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&tx_string);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&tx_string2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x1e,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&tx_string2,(Message *)&tx_string);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tx_string2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&tx_string);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_20.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  tx_string = (char *)CONCAT71(tx_string._1_7_,handle != (void *)0x0);
  if (handle == (void *)0x0) {
    testing::Message::Message((Message *)&tx_string2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&tx_string,(AssertionResult *)"(NULL == handle)",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x1f,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&tx_string2);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&tx_string2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&local_20);
  tx_string = (char *)0x0;
  tx_string2 = (char *)0x0;
  index = 0;
  ret = CfdInitializeConfidentialTx(handle,2,0,&tx_string);
  local_78.data_ = (AssertHelperData *)((ulong)local_78.data_._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&local_78,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_78);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x27,pcVar1);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_78);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  if (ret == 0) {
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar,"\"0200000000000000000000\"","tx_string",
               "0200000000000000000000",tx_string);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_78);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x29,pcVar1);
      testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
      testing::internal::AssertHelper::~AssertHelper(&local_70);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_78);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    ret = CfdAddConfidentialTxIn
                    (handle,tx_string,
                     "7461b02405414d79e79a5050684a333c922c1136f4bdff5fb94b551394edebbd",0,0xffffffff
                     ,&tx_string2);
    local_78.data_ = local_78.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&local_78,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_78);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x2e,pcVar1);
      testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
      testing::internal::AssertHelper::~AssertHelper(&local_70);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_78);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    CfdFreeStringBuffer(tx_string);
    tx_string = tx_string2;
    tx_string2 = (char *)0x0;
    if (ret == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&gtest_ar,
                 "\"020000000001bdebed9413554bb95fffbdf436112c923c334a6850509ae7794d410524b061740000000000ffffffff0000000000\""
                 ,"tx_string",
                 "020000000001bdebed9413554bb95fffbdf436112c923c334a6850509ae7794d410524b061740000000000ffffffff0000000000"
                 ,tx_string);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_78);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar1 = "";
        }
        else {
          pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_70,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x36,pcVar1);
        testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
        testing::internal::AssertHelper::~AssertHelper(&local_70);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_78);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      ret = CfdAddConfidentialTxIn
                      (handle,tx_string,
                       "1497e1f146bc5fe00b6268ea16a7069ecb90a2a41a183446d5df8965d2356dc1",1,
                       0xffffffff,&tx_string2);
      local_78.data_ = local_78.data_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<CfdErrorCode,int>
                ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&local_78,&ret);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_78);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar1 = "";
        }
        else {
          pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_70,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x3b,pcVar1);
        testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
        testing::internal::AssertHelper::~AssertHelper(&local_70);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_78);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      CfdFreeStringBuffer(tx_string);
      tx_string = tx_string2;
      tx_string2 = (char *)0x0;
      if (ret == 0) {
        testing::internal::CmpHelperSTREQ
                  ((internal *)&gtest_ar,
                   "\"020000000002bdebed9413554bb95fffbdf436112c923c334a6850509ae7794d410524b061740000000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140100000000ffffffff0000000000\""
                   ,"tx_string",
                   "020000000002bdebed9413554bb95fffbdf436112c923c334a6850509ae7794d410524b061740000000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140100000000ffffffff0000000000"
                   ,tx_string);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_78);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar1 = "";
          }
          else {
            pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_70,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                     ,0x43,pcVar1);
          testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
          testing::internal::AssertHelper::~AssertHelper(&local_70);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_78);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        ret = CfdAddConfidentialTxIn
                        (handle,tx_string,
                         "1497e1f146bc5fe00b6268ea16a7069ecb90a2a41a183446d5df8965d2356dc1",2,
                         0xffffffff,&tx_string2);
        local_78.data_ = local_78.data_ & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<CfdErrorCode,int>
                  ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&local_78,&ret);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_78);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar1 = "";
          }
          else {
            pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_70,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                     ,0x48,pcVar1);
          testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
          testing::internal::AssertHelper::~AssertHelper(&local_70);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_78);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        CfdFreeStringBuffer(tx_string);
        tx_string = tx_string2;
        tx_string2 = (char *)0x0;
        if (ret == 0) {
          testing::internal::CmpHelperSTREQ
                    ((internal *)&gtest_ar,
                     "\"020000000003bdebed9413554bb95fffbdf436112c923c334a6850509ae7794d410524b061740000000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140100000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140200000000ffffffff0000000000\""
                     ,"tx_string",
                     "020000000003bdebed9413554bb95fffbdf436112c923c334a6850509ae7794d410524b061740000000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140100000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140200000000ffffffff0000000000"
                     ,tx_string);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&local_78);
            if (gtest_ar.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar1 = "";
            }
            else {
              pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_70,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                       ,0x50,pcVar1);
            testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
            testing::internal::AssertHelper::~AssertHelper(&local_70);
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_78);
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          index = 0;
          ret = CfdGetConfidentialTxInIndex
                          (handle,tx_string,
                           "1497e1f146bc5fe00b6268ea16a7069ecb90a2a41a183446d5df8965d2356dc1",1,
                           &index);
          local_78.data_ = local_78.data_ & 0xffffffff00000000;
          testing::internal::CmpHelperEQ<CfdErrorCode,int>
                    ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&local_78,&ret);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&local_78);
            if (gtest_ar.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar1 = "";
            }
            else {
              pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_70,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                       ,0x56,pcVar1);
            testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
            testing::internal::AssertHelper::~AssertHelper(&local_70);
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_78);
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          local_78.data_._0_4_ = 1;
          testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                    ((internal *)&gtest_ar,"(uint32_t)1","index",(uint *)&local_78,&index);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&local_78);
            if (gtest_ar.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar1 = "";
            }
            else {
              pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_70,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                       ,0x57,pcVar1);
            testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
            testing::internal::AssertHelper::~AssertHelper(&local_70);
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_78);
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          if (ret == 0) {
            ret = CfdAddConfidentialTxOut
                            (handle,tx_string,
                             "ef47c42d34de1b06a02212e8061323f50d5f02ceed202f1cb375932aa299f751",
                             100000000,(char *)0x0,
                             "CTEw7oSCUWDfmfhCEdsB3gsG7D9b4xLCZEq71H8JxRFeBu7yQN3CbSF6qT6J4F7qji4bq1jVSdVcqvRJ"
                             ,(char *)0x0,(char *)0x0,&tx_string2);
            local_78.data_ = local_78.data_ & 0xffffffff00000000;
            testing::internal::CmpHelperEQ<CfdErrorCode,int>
                      ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&local_78,&ret);
            if (gtest_ar.success_ == false) {
              testing::Message::Message((Message *)&local_78);
              if (gtest_ar.message_.ptr_ ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar1 = "";
              }
              else {
                pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_70,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                         ,0x60,pcVar1);
              testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
              testing::internal::AssertHelper::~AssertHelper(&local_70);
              testing::internal::
              scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&local_78);
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr(&gtest_ar.message_);
            CfdFreeStringBuffer(tx_string);
            tx_string = tx_string2;
            tx_string2 = (char *)0x0;
            if (ret == 0) {
              testing::internal::CmpHelperSTREQ
                        ((internal *)&gtest_ar,
                         "\"020000000003bdebed9413554bb95fffbdf436112c923c334a6850509ae7794d410524b061740000000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140100000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140200000000ffffffff010151f799a22a9375b31c2f20edce025f0df5231306e81222a0061bde342dc447ef010000000005f5e10003a630456ab6d50b57981e085abced70e2816289ae2b49a44c2f471b205134c12b1976a914d08f5ba8874d36cf97d19379b370f1f23ba36d5888ac00000000\""
                         ,"tx_string",
                         "020000000003bdebed9413554bb95fffbdf436112c923c334a6850509ae7794d410524b061740000000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140100000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140200000000ffffffff010151f799a22a9375b31c2f20edce025f0df5231306e81222a0061bde342dc447ef010000000005f5e10003a630456ab6d50b57981e085abced70e2816289ae2b49a44c2f471b205134c12b1976a914d08f5ba8874d36cf97d19379b370f1f23ba36d5888ac00000000"
                         ,tx_string);
              if (gtest_ar.success_ == false) {
                testing::Message::Message((Message *)&local_78);
                if (gtest_ar.message_.ptr_ ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar1 = "";
                }
                else {
                  pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_70,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                           ,0x68,pcVar1);
                testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
                testing::internal::AssertHelper::~AssertHelper(&local_70);
                testing::internal::
                scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_78);
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&gtest_ar.message_);
              ret = CfdAddConfidentialTxOut
                              (handle,tx_string,
                               "6f1a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3",
                               0x71475420,(char *)0x0,"2dxZw5iVZ6Pmqoc5Vn8gkUWDGB5dXuMBCmM",
                               (char *)0x0,(char *)0x0,&tx_string2);
              local_78.data_ = local_78.data_ & 0xffffffff00000000;
              testing::internal::CmpHelperEQ<CfdErrorCode,int>
                        ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&local_78,&ret);
              if (gtest_ar.success_ == false) {
                testing::Message::Message((Message *)&local_78);
                if (gtest_ar.message_.ptr_ ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar1 = "";
                }
                else {
                  pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_70,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                           ,0x6f,pcVar1);
                testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
                testing::internal::AssertHelper::~AssertHelper(&local_70);
                testing::internal::
                scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_78);
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&gtest_ar.message_);
              CfdFreeStringBuffer(tx_string);
              tx_string = tx_string2;
              tx_string2 = (char *)0x0;
              if (ret == 0) {
                testing::internal::CmpHelperSTREQ
                          ((internal *)&gtest_ar,
                           "\"020000000003bdebed9413554bb95fffbdf436112c923c334a6850509ae7794d410524b061740000000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140100000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140200000000ffffffff020151f799a22a9375b31c2f20edce025f0df5231306e81222a0061bde342dc447ef010000000005f5e10003a630456ab6d50b57981e085abced70e2816289ae2b49a44c2f471b205134c12b1976a914d08f5ba8874d36cf97d19379b370f1f23ba36d5888ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000071475420001976a914fdd725970db682de970e7669646ed7afb8348ea188ac00000000\""
                           ,"tx_string",
                           "020000000003bdebed9413554bb95fffbdf436112c923c334a6850509ae7794d410524b061740000000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140100000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140200000000ffffffff020151f799a22a9375b31c2f20edce025f0df5231306e81222a0061bde342dc447ef010000000005f5e10003a630456ab6d50b57981e085abced70e2816289ae2b49a44c2f471b205134c12b1976a914d08f5ba8874d36cf97d19379b370f1f23ba36d5888ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000071475420001976a914fdd725970db682de970e7669646ed7afb8348ea188ac00000000"
                           ,tx_string);
                if (gtest_ar.success_ == false) {
                  testing::Message::Message((Message *)&local_78);
                  if (gtest_ar.message_.ptr_ ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar1 = "";
                  }
                  else {
                    pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_70,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                             ,0x77,pcVar1);
                  testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
                  testing::internal::AssertHelper::~AssertHelper(&local_70);
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&local_78);
                }
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr(&gtest_ar.message_);
                ret = CfdAddConfidentialTxOut
                                (handle,tx_string,
                                 "6f1a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3",
                                 500000,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0,&tx_string2)
                ;
                local_78.data_ = local_78.data_ & 0xffffffff00000000;
                testing::internal::CmpHelperEQ<CfdErrorCode,int>
                          ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&local_78,&ret)
                ;
                if (gtest_ar.success_ == false) {
                  testing::Message::Message((Message *)&local_78);
                  if (gtest_ar.message_.ptr_ ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar1 = "";
                  }
                  else {
                    pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_70,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                             ,0x7e,pcVar1);
                  testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
                  testing::internal::AssertHelper::~AssertHelper(&local_70);
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&local_78);
                }
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr(&gtest_ar.message_);
                CfdFreeStringBuffer(tx_string);
                tx_string = tx_string2;
                tx_string2 = (char *)0x0;
                if (ret == 0) {
                  ret = CfdGetConfidentialTxOutIndex
                                  (handle,tx_string,
                                   "CTEw7oSCUWDfmfhCEdsB3gsG7D9b4xLCZEq71H8JxRFeBu7yQN3CbSF6qT6J4F7qji4bq1jVSdVcqvRJ"
                                   ,(char *)0x0,&index);
                  local_78.data_ = local_78.data_ & 0xffffffff00000000;
                  testing::internal::CmpHelperEQ<CfdErrorCode,int>
                            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&local_78,
                             &ret);
                  if (gtest_ar.success_ == false) {
                    testing::Message::Message((Message *)&local_78);
                    if (gtest_ar.message_.ptr_ ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar1 = "";
                    }
                    else {
                      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&local_70,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                               ,0x89,pcVar1);
                    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
                    testing::internal::AssertHelper::~AssertHelper(&local_70);
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&local_78);
                  }
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~scoped_ptr(&gtest_ar.message_);
                  local_78.data_ = local_78.data_ & 0xffffffff00000000;
                  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                            ((internal *)&gtest_ar,"(uint32_t)0","index",(uint *)&local_78,&index);
                  if (gtest_ar.success_ == false) {
                    testing::Message::Message((Message *)&local_78);
                    if (gtest_ar.message_.ptr_ ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar1 = "";
                    }
                    else {
                      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&local_70,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                               ,0x8a,pcVar1);
                    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
                    testing::internal::AssertHelper::~AssertHelper(&local_70);
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&local_78);
                  }
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~scoped_ptr(&gtest_ar.message_);
                  if (ret == 0) {
                    pcVar1 = "";
                    ret = CfdGetConfidentialTxOutIndex
                                    (handle,tx_string,"",
                                     "76a914d08f5ba8874d36cf97d19379b370f1f23ba36d5888ac",&index);
                    local_78.data_ = local_78.data_ & 0xffffffff00000000;
                    testing::internal::CmpHelperEQ<CfdErrorCode,int>
                              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&local_78,
                               &ret);
                    if (gtest_ar.success_ == false) {
                      testing::Message::Message((Message *)&local_78);
                      if (gtest_ar.message_.ptr_ !=
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                (&local_70,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                                 ,0x90,pcVar1);
                      testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
                      testing::internal::AssertHelper::~AssertHelper(&local_70);
                      testing::internal::
                      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&local_78);
                    }
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::~scoped_ptr(&gtest_ar.message_);
                    local_78.data_ = local_78.data_ & 0xffffffff00000000;
                    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                              ((internal *)&gtest_ar,"(uint32_t)0","index",(uint *)&local_78,&index)
                    ;
                    if (gtest_ar.success_ == false) {
                      testing::Message::Message((Message *)&local_78);
                      if (gtest_ar.message_.ptr_ ==
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        pcVar1 = "";
                      }
                      else {
                        pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                (&local_70,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                                 ,0x91,pcVar1);
                      testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
                      testing::internal::AssertHelper::~AssertHelper(&local_70);
                      testing::internal::
                      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&local_78);
                    }
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::~scoped_ptr(&gtest_ar.message_);
                    if (ret == 0) {
                      ret = CfdGetConfidentialTxOutIndex
                                      (handle,tx_string,"2dxZw5iVZ6Pmqoc5Vn8gkUWDGB5dXuMBCmM",
                                       (char *)0x0,&index);
                      local_78.data_ = local_78.data_ & 0xffffffff00000000;
                      testing::internal::CmpHelperEQ<CfdErrorCode,int>
                                ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&local_78
                                 ,&ret);
                      if (gtest_ar.success_ == false) {
                        testing::Message::Message((Message *)&local_78);
                        if (gtest_ar.message_.ptr_ ==
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           ) {
                          pcVar1 = "";
                        }
                        else {
                          pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_70,kNonFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                                   ,0x98,pcVar1);
                        testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
                        testing::internal::AssertHelper::~AssertHelper(&local_70);
                        testing::internal::
                        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)&local_78);
                      }
                      testing::internal::
                      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~scoped_ptr(&gtest_ar.message_);
                      local_78.data_._0_4_ = 1;
                      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                                ((internal *)&gtest_ar,"(uint32_t)1","index",(uint *)&local_78,
                                 &index);
                      if (gtest_ar.success_ == false) {
                        testing::Message::Message((Message *)&local_78);
                        if (gtest_ar.message_.ptr_ ==
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           ) {
                          pcVar1 = "";
                        }
                        else {
                          pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_70,kNonFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                                   ,0x99,pcVar1);
                        testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
                        testing::internal::AssertHelper::~AssertHelper(&local_70);
                        testing::internal::
                        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)&local_78);
                      }
                      testing::internal::
                      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~scoped_ptr(&gtest_ar.message_);
                      if (ret == 0) {
                        pcVar1 = "";
                        ret = CfdGetConfidentialTxOutIndex
                                        (handle,tx_string,"",
                                         "76a914fdd725970db682de970e7669646ed7afb8348ea188ac",&index
                                        );
                        local_78.data_ = local_78.data_ & 0xffffffff00000000;
                        testing::internal::CmpHelperEQ<CfdErrorCode,int>
                                  ((internal *)&gtest_ar,"kCfdSuccess","ret",
                                   (CfdErrorCode *)&local_78,&ret);
                        if (gtest_ar.success_ == false) {
                          testing::Message::Message((Message *)&local_78);
                          if (gtest_ar.message_.ptr_ !=
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                            pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                          }
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_70,kNonFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                                     ,0x9f,pcVar1);
                          testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78)
                          ;
                          testing::internal::AssertHelper::~AssertHelper(&local_70);
                          testing::internal::
                          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         *)&local_78);
                        }
                        testing::internal::
                        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::~scoped_ptr(&gtest_ar.message_);
                        local_78.data_._0_4_ = 1;
                        testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                                  ((internal *)&gtest_ar,"(uint32_t)1","index",(uint *)&local_78,
                                   &index);
                        if (gtest_ar.success_ == false) {
                          testing::Message::Message((Message *)&local_78);
                          if (gtest_ar.message_.ptr_ ==
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                            pcVar1 = "";
                          }
                          else {
                            pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                          }
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_70,kNonFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                                     ,0xa0,pcVar1);
                          testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78)
                          ;
                          testing::internal::AssertHelper::~AssertHelper(&local_70);
                          testing::internal::
                          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         *)&local_78);
                        }
                        testing::internal::
                        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::~scoped_ptr(&gtest_ar.message_);
                        if (ret == 0) {
                          ret = CfdGetConfidentialTxOutIndex
                                          (handle,tx_string,(char *)0x0,(char *)0x0,&index);
                          local_78.data_ = local_78.data_ & 0xffffffff00000000;
                          testing::internal::CmpHelperEQ<CfdErrorCode,int>
                                    ((internal *)&gtest_ar,"kCfdSuccess","ret",
                                     (CfdErrorCode *)&local_78,&ret);
                          if (gtest_ar.success_ == false) {
                            testing::Message::Message((Message *)&local_78);
                            if (gtest_ar.message_.ptr_ ==
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0) {
                              pcVar1 = "";
                            }
                            else {
                              pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_70,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                                       ,0xa6,pcVar1);
                            testing::internal::AssertHelper::operator=
                                      (&local_70,(Message *)&local_78);
                            testing::internal::AssertHelper::~AssertHelper(&local_70);
                            testing::internal::
                            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                           *)&local_78);
                          }
                          testing::internal::
                          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::~scoped_ptr(&gtest_ar.message_);
                          local_78.data_._0_4_ = 2;
                          testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                                    ((internal *)&gtest_ar,"(uint32_t)2","index",(uint *)&local_78,
                                     &index);
                          if (gtest_ar.success_ == false) {
                            testing::Message::Message((Message *)&local_78);
                            if (gtest_ar.message_.ptr_ ==
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0) {
                              pcVar1 = "";
                            }
                            else {
                              pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_70,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                                       ,0xa7,pcVar1);
                            testing::internal::AssertHelper::operator=
                                      (&local_70,(Message *)&local_78);
                            testing::internal::AssertHelper::~AssertHelper(&local_70);
                            testing::internal::
                            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                           *)&local_78);
                          }
                          testing::internal::
                          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::~scoped_ptr(&gtest_ar.message_);
                          if (ret == 0) {
                            testing::internal::CmpHelperSTREQ
                                      ((internal *)&gtest_ar,
                                       "\"020000000003bdebed9413554bb95fffbdf436112c923c334a6850509ae7794d410524b061740000000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140100000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140200000000ffffffff030151f799a22a9375b31c2f20edce025f0df5231306e81222a0061bde342dc447ef010000000005f5e10003a630456ab6d50b57981e085abced70e2816289ae2b49a44c2f471b205134c12b1976a914d08f5ba8874d36cf97d19379b370f1f23ba36d5888ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000071475420001976a914fdd725970db682de970e7669646ed7afb8348ea188ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f01000000000007a120000000000000\""
                                       ,"tx_string",
                                       "020000000003bdebed9413554bb95fffbdf436112c923c334a6850509ae7794d410524b061740000000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140100000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140200000000ffffffff030151f799a22a9375b31c2f20edce025f0df5231306e81222a0061bde342dc447ef010000000005f5e10003a630456ab6d50b57981e085abced70e2816289ae2b49a44c2f471b205134c12b1976a914d08f5ba8874d36cf97d19379b370f1f23ba36d5888ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000071475420001976a914fdd725970db682de970e7669646ed7afb8348ea188ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f01000000000007a120000000000000"
                                       ,tx_string);
                            if (gtest_ar.success_ == false) {
                              testing::Message::Message((Message *)&local_78);
                              if (gtest_ar.message_.ptr_ ==
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                pcVar1 = "";
                              }
                              else {
                                pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                              }
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_70,kNonFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                                         ,0xab,pcVar1);
                              testing::internal::AssertHelper::operator=
                                        (&local_70,(Message *)&local_78);
                              testing::internal::AssertHelper::~AssertHelper(&local_70);
                              testing::internal::
                              scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                             *)&local_78);
                            }
                            testing::internal::
                            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::~scoped_ptr(&gtest_ar.message_);
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  ret = CfdGetLastErrorCode(handle);
  if (ret != 0) {
    local_78.data_ = (AssertHelperData *)0x0;
    ret = CfdGetLastErrorMessage(handle,(char **)&local_78);
    local_70.data_._0_4_ = 0;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&local_70,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_70);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_18,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0xb2,pcVar1);
      testing::internal::AssertHelper::operator=(&local_18,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_18);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_70);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    pcVar1 = "";
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar,"\"\"","str_buffer","",(char *)local_78.data_);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_70);
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_18,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0xb3,pcVar1);
      testing::internal::AssertHelper::operator=(&local_18,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_18);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_70);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    CfdFreeStringBuffer((char *)local_78.data_);
    if (ret != 0) goto LAB_002592a5;
  }
  ret = CfdGetConfidentialTxInIndex
                  (handle,tx_string,
                   "1497e1f146bc5fe00b6268ea16a7069ecb90a2a41a183446d5df8965d2356dc1",3,&index);
  local_78.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdIllegalArgumentError","ret",(CfdErrorCode *)&local_78,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_78);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0xbc,pcVar1);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_78);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  if (ret != 0) {
    if (ret != 1) goto LAB_002592a5;
    ret = 0;
  }
  ret = CfdGetConfidentialTxOutIndex
                  (handle,tx_string,(char *)0x0,"76a914fdd825970db682de970e7669646ed7afb8348ea188ac"
                   ,&index);
  local_78.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdIllegalArgumentError","ret",(CfdErrorCode *)&local_78,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_78);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0xc5,pcVar1);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_78);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  if (ret == 1) {
    ret = 0;
  }
LAB_002592a5:
  ret = CfdGetLastErrorCode(handle);
  if (ret != 0) {
    local_78.data_ = (AssertHelperData *)0x0;
    ret = CfdGetLastErrorMessage(handle,(char **)&local_78);
    local_70.data_._0_4_ = 0;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&local_70,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_70);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_18,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0xcf,pcVar1);
      testing::internal::AssertHelper::operator=(&local_18,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_18);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_70);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar,"\"Failed to parameter. search target is not found.\"",
               "str_buffer","Failed to parameter. search target is not found.",
               (char *)local_78.data_);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_70);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_18,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0xd0,pcVar1);
      testing::internal::AssertHelper::operator=(&local_18,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_18);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_70);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    CfdFreeStringBuffer((char *)local_78.data_);
  }
  if (tx_string != (char *)0x0) {
    CfdFreeStringBuffer(tx_string);
  }
  ret = CfdFreeHandle(handle);
  local_78.data_ = local_78.data_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&local_78,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_78);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0xda,pcVar1);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_78);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(cfdcapi_elements_transaction, CreateRawTransaction) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  char* tx_string = nullptr;
  char* tx_string2 = nullptr;
  int64_t satoshi;
  uint32_t index = 0;

  ret = CfdInitializeConfidentialTx(handle, 2, 0, &tx_string);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    EXPECT_STREQ("0200000000000000000000", tx_string);

    ret = CfdAddConfidentialTxIn(
      handle, tx_string, "7461b02405414d79e79a5050684a333c922c1136f4bdff5fb94b551394edebbd", 0,
      4294967295U, &tx_string2);
    EXPECT_EQ(kCfdSuccess, ret);

    CfdFreeStringBuffer(tx_string);
    tx_string = tx_string2;
    tx_string2 = nullptr;
  }

  if (ret == kCfdSuccess) {
    EXPECT_STREQ("020000000001bdebed9413554bb95fffbdf436112c923c334a6850509ae7794d410524b061740000000000ffffffff0000000000", tx_string);

    ret = CfdAddConfidentialTxIn(
      handle, tx_string, "1497e1f146bc5fe00b6268ea16a7069ecb90a2a41a183446d5df8965d2356dc1", 1,
      4294967295U, &tx_string2);
    EXPECT_EQ(kCfdSuccess, ret);

    CfdFreeStringBuffer(tx_string);
    tx_string = tx_string2;
    tx_string2 = nullptr;
  }

  if (ret == kCfdSuccess) {
    EXPECT_STREQ("020000000002bdebed9413554bb95fffbdf436112c923c334a6850509ae7794d410524b061740000000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140100000000ffffffff0000000000", tx_string);

    ret = CfdAddConfidentialTxIn(
      handle, tx_string, "1497e1f146bc5fe00b6268ea16a7069ecb90a2a41a183446d5df8965d2356dc1", 2,
      4294967295U, &tx_string2);
    EXPECT_EQ(kCfdSuccess, ret);

    CfdFreeStringBuffer(tx_string);
    tx_string = tx_string2;
    tx_string2 = nullptr;
  }

  if (ret == kCfdSuccess) {
    EXPECT_STREQ("020000000003bdebed9413554bb95fffbdf436112c923c334a6850509ae7794d410524b061740000000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140100000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140200000000ffffffff0000000000", tx_string);

    index = 0;
    ret = CfdGetConfidentialTxInIndex(
      handle, tx_string, "1497e1f146bc5fe00b6268ea16a7069ecb90a2a41a183446d5df8965d2356dc1", 1,
      &index);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ((uint32_t)1, index);
  }

  if (ret == kCfdSuccess) {
    satoshi = 100000000;
    ret = CfdAddConfidentialTxOut(
      handle, tx_string, "ef47c42d34de1b06a02212e8061323f50d5f02ceed202f1cb375932aa299f751",
      satoshi, nullptr, "CTEw7oSCUWDfmfhCEdsB3gsG7D9b4xLCZEq71H8JxRFeBu7yQN3CbSF6qT6J4F7qji4bq1jVSdVcqvRJ",
      nullptr, nullptr, &tx_string2);
    EXPECT_EQ(kCfdSuccess, ret);

    CfdFreeStringBuffer(tx_string);
    tx_string = tx_string2;
    tx_string2 = nullptr;
  }

  if (ret == kCfdSuccess) {
    EXPECT_STREQ("020000000003bdebed9413554bb95fffbdf436112c923c334a6850509ae7794d410524b061740000000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140100000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140200000000ffffffff010151f799a22a9375b31c2f20edce025f0df5231306e81222a0061bde342dc447ef010000000005f5e10003a630456ab6d50b57981e085abced70e2816289ae2b49a44c2f471b205134c12b1976a914d08f5ba8874d36cf97d19379b370f1f23ba36d5888ac00000000", tx_string);

    satoshi = 1900500000;
    ret = CfdAddConfidentialTxOut(
      handle, tx_string, "6f1a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3",
      satoshi, nullptr, "2dxZw5iVZ6Pmqoc5Vn8gkUWDGB5dXuMBCmM",
      nullptr, nullptr, &tx_string2);
    EXPECT_EQ(kCfdSuccess, ret);

    CfdFreeStringBuffer(tx_string);
    tx_string = tx_string2;
    tx_string2 = nullptr;
  }

  if (ret == kCfdSuccess) {
    EXPECT_STREQ("020000000003bdebed9413554bb95fffbdf436112c923c334a6850509ae7794d410524b061740000000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140100000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140200000000ffffffff020151f799a22a9375b31c2f20edce025f0df5231306e81222a0061bde342dc447ef010000000005f5e10003a630456ab6d50b57981e085abced70e2816289ae2b49a44c2f471b205134c12b1976a914d08f5ba8874d36cf97d19379b370f1f23ba36d5888ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000071475420001976a914fdd725970db682de970e7669646ed7afb8348ea188ac00000000", tx_string);

    satoshi = 500000;
    ret = CfdAddConfidentialTxOut(
      handle, tx_string, "6f1a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3",
      satoshi, nullptr, nullptr,
      nullptr, nullptr, &tx_string2);
    EXPECT_EQ(kCfdSuccess, ret);

    CfdFreeStringBuffer(tx_string);
    tx_string = tx_string2;
    tx_string2 = nullptr;
  }

  if (ret == kCfdSuccess) {
    ret = CfdGetConfidentialTxOutIndex(
      handle, tx_string, "CTEw7oSCUWDfmfhCEdsB3gsG7D9b4xLCZEq71H8JxRFeBu7yQN3CbSF6qT6J4F7qji4bq1jVSdVcqvRJ", NULL,
      &index);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ((uint32_t)0, index);
  }

  if (ret == kCfdSuccess) {
    ret = CfdGetConfidentialTxOutIndex(
      handle, tx_string, "", "76a914d08f5ba8874d36cf97d19379b370f1f23ba36d5888ac", &index);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ((uint32_t)0, index);
  }

  if (ret == kCfdSuccess) {
    ret = CfdGetConfidentialTxOutIndex(
      handle, tx_string, "2dxZw5iVZ6Pmqoc5Vn8gkUWDGB5dXuMBCmM", NULL,
      &index);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ((uint32_t)1, index);
  }

  if (ret == kCfdSuccess) {
    ret = CfdGetConfidentialTxOutIndex(
      handle, tx_string, "", "76a914fdd725970db682de970e7669646ed7afb8348ea188ac", &index);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ((uint32_t)1, index);
  }

  if (ret == kCfdSuccess) {
    ret = CfdGetConfidentialTxOutIndex(
      handle, tx_string, NULL, NULL, &index);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ((uint32_t)2, index);
  }

  if (ret == kCfdSuccess) {
    EXPECT_STREQ("020000000003bdebed9413554bb95fffbdf436112c923c334a6850509ae7794d410524b061740000000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140100000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140200000000ffffffff030151f799a22a9375b31c2f20edce025f0df5231306e81222a0061bde342dc447ef010000000005f5e10003a630456ab6d50b57981e085abced70e2816289ae2b49a44c2f471b205134c12b1976a914d08f5ba8874d36cf97d19379b370f1f23ba36d5888ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000071475420001976a914fdd725970db682de970e7669646ed7afb8348ea188ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f01000000000007a120000000000000", tx_string);
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  if (ret == kCfdSuccess) {
    ret = CfdGetConfidentialTxInIndex(
      handle, tx_string, "1497e1f146bc5fe00b6268ea16a7069ecb90a2a41a183446d5df8965d2356dc1", 3,
      &index);
    EXPECT_EQ(kCfdIllegalArgumentError, ret);
    if (ret == kCfdIllegalArgumentError) {
      ret = kCfdSuccess;
    }
  }

  if (ret == kCfdSuccess) {
    ret = CfdGetConfidentialTxOutIndex(
      handle, tx_string, NULL, "76a914fdd825970db682de970e7669646ed7afb8348ea188ac", &index);
    EXPECT_EQ(kCfdIllegalArgumentError, ret);
    if (ret == kCfdIllegalArgumentError) {
      ret = kCfdSuccess;
    }
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("Failed to parameter. search target is not found.", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  if (tx_string != nullptr) {
    CfdFreeStringBuffer(tx_string);
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}